

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_impl.cpp
# Opt level: O0

void __thiscall gamespace::GameScreenImpl::createContextForLookAt(GameScreenImpl *this)

{
  CoordinateMenu *this_00;
  bool bVar1;
  pointer this_01;
  BoardTile *b;
  UI *dui;
  vec2 res;
  dvec2 mp;
  anon_class_8_1_54a39815 local_20;
  Unit *local_18;
  Unit *u;
  GameScreenImpl *this_local;
  
  if ((this->_selection).hovering != (BoardTile *)0x0) {
    u = (Unit *)this;
    local_18 = BoardTile::unit((this->_selection).hovering);
    bVar1 = false;
    if (local_18 != (Unit *)0x0) {
      this_01 = std::unique_ptr<ui::UI,_std::default_delete<ui::UI>_>::operator->(&this->_ui);
      local_20.u = local_18;
      bVar1 = ::ui::UI::hasModelMatching<gamespace::GameScreenImpl::createContextForLookAt()::__0>
                        (this_01,&local_20);
      bVar1 = !bVar1;
    }
    if (bVar1) {
      this_00 = (CoordinateMenu *)(this->_selection).hovering;
      b = (BoardTile *)std::unique_ptr<ui::UI,_std::default_delete<ui::UI>_>::get(&this->_ui);
      res = qe::Context::getResolution(this->_ctxt);
      mp = qe::Context::getMousePos(this->_ctxt);
      CoordinateMenu::createForTile(this_00,b,dui,res,mp);
    }
  }
  return;
}

Assistant:

void GameScreenImpl::createContextForLookAt() {
    if(_selection.hovering == nullptr) return;
    auto *u = _selection.hovering->unit();
    if(u && _ui->hasModelMatching([u](std::string name, void *m){return name == "unitctxt" && ((CoordinateMenu*)m)->unit() == u;}) == false)
        CoordinateMenu::createForTile(_selection.hovering, _ui.get(), _ctxt->getResolution(), _ctxt->getMousePos());
}